

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcPrePartialsPartials
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,double *partials1,double *matrices1,
          double *partials2,double *matrices2,int startPattern,int endPattern)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  double dVar11;
  undefined1 auVar12 [16];
  int iVar13;
  double *pdVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  double *pdVar19;
  double *pdVar20;
  int i;
  ulong uVar21;
  ulong uVar22;
  double *pdVar23;
  double *pdVar24;
  double *pdVar25;
  long lVar26;
  double *pdVar27;
  double *pdVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double *local_b0;
  double *local_a8;
  double *local_a0;
  double *local_80;
  double *local_78;
  
  uVar6 = this->kStateCount;
  iVar7 = this->kPartialsSize;
  for (lVar17 = 0; (long)iVar7 * 8 != lVar17; lVar17 = lVar17 + 8) {
    *(undefined8 *)((long)destP + lVar17) = 0;
  }
  uVar8 = this->kCategoryCount;
  iVar7 = this->kPartialsPaddedStateCount;
  iVar9 = this->kPatternCount;
  iVar10 = this->kMatrixSize;
  iVar13 = uVar6 + 1;
  lVar17 = (long)((int)uVar6 / 4 << 2);
  iVar15 = iVar7 * startPattern;
  local_78 = matrices2 + 2;
  local_80 = matrices1 + 3;
  local_b0 = matrices1;
  local_a8 = matrices2;
  for (uVar22 = 0; uVar22 != (~((int)uVar8 >> 0x1f) & uVar8); uVar22 = uVar22 + 1) {
    pdVar28 = partials2 + iVar15;
    iVar16 = (iVar9 * (int)uVar22 + startPattern) * iVar7;
    pdVar23 = destP + iVar16;
    local_a0 = partials1 + iVar16;
    for (iVar16 = startPattern; iVar16 < endPattern; iVar16 = iVar16 + 1) {
      pdVar14 = local_b0;
      pdVar20 = local_a8;
      pdVar25 = local_78;
      pdVar27 = local_80;
      for (uVar21 = 0; uVar21 != (~((int)uVar6 >> 0x1f) & uVar6); uVar21 = uVar21 + 1) {
        auVar29 = ZEXT816(0) << 0x40;
        pdVar19 = pdVar28;
        pdVar24 = pdVar20;
        for (lVar18 = 0; auVar12 = auVar29, lVar18 < lVar17; lVar18 = lVar18 + 4) {
          pdVar19 = pdVar19 + 4;
          pdVar24 = pdVar24 + 4;
          auVar29 = vfmadd231pd_fma(auVar29,*(undefined1 (*) [16])(pdVar25 + lVar18 + -2),
                                    *(undefined1 (*) [16])(pdVar28 + lVar18));
          auVar29 = vfmadd231pd_fma(auVar29,*(undefined1 (*) [16])(pdVar25 + lVar18),
                                    *(undefined1 (*) [16])(pdVar28 + lVar18 + 2));
        }
        while (lVar18 < (int)uVar6) {
          auVar36._8_8_ = 0;
          auVar36._0_8_ = *pdVar24;
          lVar18 = lVar18 + 1;
          pdVar24 = pdVar24 + 1;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *pdVar19;
          auVar12 = vfmadd231sd_fma(auVar12,auVar36,auVar1);
          pdVar19 = pdVar19 + 1;
        }
        auVar29 = vshufpd_avx(auVar29,auVar29,1);
        lVar18 = 0;
        dVar11 = (auVar29._0_8_ + auVar12._0_8_) * local_a0[uVar21];
        pdVar19 = pdVar23;
        pdVar24 = pdVar14;
        while (auVar29._8_8_ = 0, auVar29._0_8_ = dVar11, lVar18 < lVar17) {
          auVar31._8_8_ = 0;
          auVar31._0_8_ = pdVar27[lVar18 + -3];
          pdVar24 = pdVar24 + 4;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = *pdVar19;
          auVar29 = vfmadd213sd_fma(auVar31,auVar29,auVar12);
          *pdVar19 = auVar29._0_8_;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = pdVar27[lVar18 + -2];
          auVar2._8_8_ = 0;
          auVar2._0_8_ = pdVar19[1];
          auVar30._8_8_ = 0;
          auVar30._0_8_ = dVar11;
          auVar29 = vfmadd213sd_fma(auVar32,auVar30,auVar2);
          pdVar19[1] = auVar29._0_8_;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = pdVar27[lVar18 + -1];
          auVar3._8_8_ = 0;
          auVar3._0_8_ = pdVar19[2];
          auVar29 = vfmadd213sd_fma(auVar33,auVar30,auVar3);
          pdVar19[2] = auVar29._0_8_;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = pdVar27[lVar18];
          lVar18 = lVar18 + 4;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = pdVar19[3];
          auVar29 = vfmadd213sd_fma(auVar34,auVar30,auVar4);
          pdVar19[3] = auVar29._0_8_;
          pdVar19 = pdVar19 + 4;
        }
        for (lVar26 = 0; lVar18 + lVar26 < (long)(int)uVar6; lVar26 = lVar26 + 1) {
          auVar35._8_8_ = 0;
          auVar35._0_8_ = *pdVar24;
          pdVar24 = pdVar24 + 1;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = pdVar19[lVar26];
          auVar12 = vfmadd213sd_fma(auVar35,auVar29,auVar5);
          pdVar19[lVar26] = auVar12._0_8_;
        }
        pdVar25 = pdVar25 + iVar13;
        pdVar20 = pdVar20 + iVar13;
        pdVar27 = pdVar27 + iVar13;
        pdVar14 = pdVar14 + iVar13;
      }
      pdVar28 = pdVar28 + iVar7;
      local_a0 = local_a0 + iVar7;
      pdVar23 = pdVar23 + iVar7;
    }
    iVar15 = iVar15 + iVar9 * iVar7;
    local_78 = local_78 + iVar10;
    local_a8 = local_a8 + iVar10;
    local_80 = local_80 + iVar10;
    local_b0 = local_b0 + iVar10;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPrePartialsPartials(REALTYPE* destP,
                                                                const REALTYPE* partials1,
                                                                const REALTYPE* matrices1,
                                                                const REALTYPE* partials2,
                                                                const REALTYPE* matrices2,
                                                                int startPattern,
                                                                int endPattern) {
    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;
    REALTYPE* tmpdestPtr = destP;
    //clean up the partial first, set every entry to 0
    std::fill(tmpdestPtr, tmpdestPtr + kPartialsSize, 0);

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials1Ptr = &partials1[v];
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        tmpdestPtr = destPtr;
        for (int k = startPattern; k < endPattern; k++) {
            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices1Ptr = matrices1 + matrixOffset + i * matrixIncr;
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE sum2A = 0.0, sum2B = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sum2A += matrices2Ptr[j + 0] * partials2Ptr[j + 0];

                    sum2B += matrices2Ptr[j + 1] * partials2Ptr[j + 1];

                    sum2A += matrices2Ptr[j + 2] * partials2Ptr[j + 2];

                    sum2B += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }

                for (; j < kStateCount; j++) {
                    sum2A += matrices2Ptr[j] * partials2Ptr[j];
                }

                // sum2A + sum2B = M_j P_j
                // Now 2nd loop
                tmpdestPtr = destPtr;
                REALTYPE  MjPj = (sum2A + sum2B) * partials1Ptr[i];

                for (j = 0; j < stateCountModFour; j += 4) {
                    *(tmpdestPtr++) += matrices1Ptr[j + 0] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 1] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 2] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 3] * MjPj;
                }

                for (; j < kStateCount; j++) {
                    *(tmpdestPtr++) += matrices1Ptr[j] * MjPj;
                }
            }
            destPtr +=kPartialsPaddedStateCount;
            partials1Ptr += kPartialsPaddedStateCount;
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }

}